

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idna.c
# Opt level: O2

int run_test_utf8_decode1_overrun(void)

{
  uint uVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *pe;
  char b [1];
  char c [1];
  int64_t eval_b;
  int64_t eval_a;
  char *p;
  
  b[0] = '\x7f';
  eval_a = 0x7f;
  pe = c;
  p = b;
  uVar1 = uv__utf8_decode1(&p,pe);
  eval_b = (int64_t)uVar1;
  if (eval_a == eval_b) {
    if (p != pe) {
      uVar5 = 0x6d;
LAB_00147d4a:
      pcVar2 = "p";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar3 = "b + 1";
      pcVar4 = p;
      goto LAB_00147dc5;
    }
    b[0] = -0x40;
    eval_a = 0xffffffff;
    p = b;
    uVar1 = uv__utf8_decode1(&p,pe);
    eval_b = (int64_t)uVar1;
    if (eval_a == eval_b) {
      if (p != pe) {
        uVar5 = 0x73;
        goto LAB_00147d4a;
      }
      b[0] = '\x7f';
      eval_b = -0x16;
      eval_a = -0x16;
      eval_b = uv__idna_toascii(b,pe,c,(char *)&eval_b);
      if (eval_a == eval_b) {
        return 0;
      }
      pcVar3 = "uv__idna_toascii(b, b + 1, c, c + 1)";
      pcVar2 = "UV_EINVAL";
      uVar5 = 0x77;
    }
    else {
      pcVar3 = "uv__utf8_decode1(&p, b + 1)";
      pcVar2 = "(unsigned) -1";
      uVar5 = 0x72;
    }
  }
  else {
    pcVar3 = "uv__utf8_decode1(&p, b + 1)";
    pcVar2 = "0x7F";
    uVar5 = 0x6c;
  }
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  pcVar4 = (char *)eval_a;
  pe = (char *)eval_b;
LAB_00147dc5:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-idna.c"
          ,uVar5,pcVar2,"==",pcVar3,pcVar4,"==",pe);
  abort();
}

Assistant:

TEST_IMPL(utf8_decode1_overrun) {
  const char* p;
  char b[1];
  char c[1];

  /* Single byte. */
  p = b;
  b[0] = 0x7F;
  ASSERT_EQ(0x7F, uv__utf8_decode1(&p, b + 1));
  ASSERT_PTR_EQ(p, b + 1);

  /* Multi-byte. */
  p = b;
  b[0] = 0xC0;
  ASSERT_EQ((unsigned) -1, uv__utf8_decode1(&p, b + 1));
  ASSERT_PTR_EQ(p, b + 1);

  b[0] = 0x7F;
  ASSERT_EQ(UV_EINVAL, uv__idna_toascii(b, b + 0, c, c + 1));
  ASSERT_EQ(UV_EINVAL, uv__idna_toascii(b, b + 1, c, c + 1));

  return 0;
}